

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O1

void __thiscall
Js::JavascriptPromiseAnyRejectElementFunction::JavascriptPromiseAnyRejectElementFunction
          (JavascriptPromiseAnyRejectElementFunction *this,DynamicType *type,
          FunctionInfo *functionInfo,uint32 index,JavascriptArray *values,
          JavascriptPromiseCapability *capabilities,
          JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper
          *remainingElementsWrapper,
          JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyCalledWrapper)

{
  JavascriptPromiseAllResolveElementFunction::JavascriptPromiseAllResolveElementFunction
            (&this->super_JavascriptPromiseAllResolveElementFunction,type,functionInfo,index,values,
             capabilities,remainingElementsWrapper);
  (this->super_JavascriptPromiseAllResolveElementFunction).super_RuntimeFunction.
  super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject = (IRecyclerVisitedObject)&PTR_Finalize_01544380;
  Memory::Recycler::WBSetBit((char *)&this->alreadyCalledWrapper);
  (this->alreadyCalledWrapper).ptr = alreadyCalledWrapper;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->alreadyCalledWrapper);
  return;
}

Assistant:

JavascriptPromiseAnyRejectElementFunction::JavascriptPromiseAnyRejectElementFunction(DynamicType* type, FunctionInfo* functionInfo, uint32 index, JavascriptArray* values, JavascriptPromiseCapability* capabilities, JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElementsWrapper, JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper)
        : JavascriptPromiseAllResolveElementFunction(type, functionInfo, index, values, capabilities, remainingElementsWrapper), alreadyCalledWrapper(alreadyCalledWrapper)
    { }